

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiWindow * FindWindowNavFocusable(int i_start,int i_stop,int dir)

{
  ImGuiWindow *window;
  ImGuiContext *pIVar1;
  bool bVar2;
  int i;
  
  pIVar1 = GImGui;
  do {
    if ((i_start < 0) || (i_stop == i_start)) {
      return (ImGuiWindow *)0x0;
    }
    if ((pIVar1->WindowsFocusOrder).Size <= i_start) {
      return (ImGuiWindow *)0x0;
    }
    window = (pIVar1->WindowsFocusOrder).Data[(uint)i_start];
    bVar2 = ImGui::IsWindowNavFocusable(window);
    i_start = i_start + dir;
  } while (!bVar2);
  return window;
}

Assistant:

static ImGuiWindow* FindWindowNavFocusable(int i_start, int i_stop, int dir) // FIXME-OPT O(N)
{
    ImGuiContext& g = *GImGui;
    for (int i = i_start; i >= 0 && i < g.WindowsFocusOrder.Size && i != i_stop; i += dir)
        if (ImGui::IsWindowNavFocusable(g.WindowsFocusOrder[i]))
            return g.WindowsFocusOrder[i];
    return NULL;
}